

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRSearchPath.h
# Opt level: O2

string * __thiscall
MinVR::VRSearchPlugin::_selectFile
          (string *__return_storage_ptr__,VRSearchPlugin *this,string *file,string *directory)

{
  string dir_with_slash;
  string buildType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"",(allocator<char> *)&local_a0);
  std::__cxx11::string::string((string *)&local_a0,(string *)directory);
  std::operator+(&local_c0,&local_a0,"/");
  std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::operator+(&local_80,&local_a0,"lib");
  std::operator+(&local_60,&local_80,file);
  std::operator+(&local_c0,&local_60,&local_40);
  std::operator+(__return_storage_ptr__,&local_c0,".so");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string _selectFile(const std::string &file,
                          const std::string &directory) const {

    std::string buildType = "";
#ifdef MinVR_DEBUG
    buildType = "d";
#endif

    std::string dir_with_slash = directory;
    if ((dir_with_slash[dir_with_slash.length() - 1] != '/') || (dir_with_slash[dir_with_slash.length() - 1] != '\\')) {
        dir_with_slash = dir_with_slash + "/";
    }


#if defined(WIN32)
    return dir_with_slash + file + buildType + ".dll";

#elif defined(__APPLE__)
    return dir_with_slash + "lib" + file + buildType + ".dylib";

#else // Linux
    return dir_with_slash + "lib" + file + buildType + ".so";

#endif
  }